

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS
ref_shard_pair(REF_SHARD ref_shard,REF_BOOL *again,REF_INT a0,REF_INT a1,REF_INT b0,REF_INT b1)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_BOOL b_marked;
  REF_BOOL a_marked;
  int local_38;
  int local_34;
  
  uVar1 = ref_shard_marked(ref_shard,a0,a1,&local_34);
  if (uVar1 == 0) {
    uVar1 = ref_shard_marked(ref_shard,b0,b1,&local_38);
    if (uVar1 == 0) {
      if (local_34 == local_38) {
        return 0;
      }
      *again = 1;
      uVar1 = ref_shard_mark_to_split(ref_shard,a0,a1);
      if (uVar1 == 0) {
        uVar1 = ref_shard_mark_to_split(ref_shard,b0,b1);
        if (uVar1 == 0) {
          return 0;
        }
        pcVar3 = "mark b0-b1";
        uVar2 = 0xdc;
      }
      else {
        pcVar3 = "mark a0-a1";
        uVar2 = 0xdb;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar2
             ,"ref_shard_pair",(ulong)uVar1,pcVar3);
      return uVar1;
    }
    pcVar3 = "marked? b0-b1";
    uVar2 = 0xd8;
  }
  else {
    pcVar3 = "marked? a0-a1";
    uVar2 = 0xd7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar2,
         "ref_shard_pair",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_pair(REF_SHARD ref_shard, REF_BOOL *again,
                                         REF_INT a0, REF_INT a1, REF_INT b0,
                                         REF_INT b1) {
  REF_BOOL a_marked, b_marked;

  RSS(ref_shard_marked(ref_shard, a0, a1, &a_marked), "marked? a0-a1");
  RSS(ref_shard_marked(ref_shard, b0, b1, &b_marked), "marked? b0-b1");
  if (a_marked != b_marked) {
    *again = REF_TRUE;
    RSS(ref_shard_mark_to_split(ref_shard, a0, a1), "mark a0-a1");
    RSS(ref_shard_mark_to_split(ref_shard, b0, b1), "mark b0-b1");
  }

  return REF_SUCCESS;
}